

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cws.c
# Opt level: O0

void nn_cws_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_cws *cws;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  long local_28;
  
  local_28 = in_RDI;
  if (in_RDI == 0) {
    local_28 = 0;
  }
  if (in_ESI == 0xfffffffe && in_EDX == 0xfffffffd) {
    iVar1 = nn_sws_isidle((nn_sws *)0x30e298);
    if (iVar1 == 0) {
      nn_ep_stat_increment
                ((nn_ep *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8);
      nn_sws_stop((nn_sws *)0x30e2c6);
    }
    *(undefined4 *)(local_28 + 0x58) = 10;
  }
  if (*(int *)(local_28 + 0x58) == 10) {
    iVar1 = nn_sws_isidle((nn_sws *)0x30e2fc);
    if (iVar1 == 0) {
      return;
    }
    nn_backoff_stop((nn_backoff *)0x30e317);
    nn_usock_stop((nn_usock *)0x30e325);
    nn_dns_stop((nn_dns *)0x30e336);
    *(undefined4 *)(local_28 + 0x58) = 0xb;
  }
  if (*(int *)(local_28 + 0x58) == 0xb) {
    iVar1 = nn_backoff_isidle((nn_backoff *)0x30e36c);
    if (((iVar1 != 0) && (iVar1 = nn_usock_isidle((nn_usock *)0x30e37f), iVar1 != 0)) &&
       (iVar1 = nn_dns_isidle((nn_dns *)0x30e395), iVar1 != 0)) {
      *(undefined4 *)(local_28 + 0x58) = 1;
      nn_fsm_stopped_noevent((nn_fsm *)0x30e3b5);
      nn_ep_stopped((nn_ep *)0x30e3c3);
    }
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
          (ulong)*(uint *)(local_28 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/cws.c"
          ,0x143);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_cws_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_cws *cws;

    cws = nn_cont (self, struct nn_cws, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (!nn_sws_isidle (&cws->sws)) {
            nn_ep_stat_increment (cws->ep, NN_STAT_DROPPED_CONNECTIONS, 1);
            nn_sws_stop (&cws->sws);
        }
        cws->state = NN_CWS_STATE_STOPPING_SWS_FINAL;
    }
    if (nn_slow (cws->state == NN_CWS_STATE_STOPPING_SWS_FINAL)) {
        if (!nn_sws_isidle (&cws->sws))
            return;
        nn_backoff_stop (&cws->retry);
        nn_usock_stop (&cws->usock);
        nn_dns_stop (&cws->dns);
        cws->state = NN_CWS_STATE_STOPPING;
    }
    if (nn_slow (cws->state == NN_CWS_STATE_STOPPING)) {
        if (!nn_backoff_isidle (&cws->retry) ||
              !nn_usock_isidle (&cws->usock) ||
              !nn_dns_isidle (&cws->dns))
            return;
        cws->state = NN_CWS_STATE_IDLE;
        nn_fsm_stopped_noevent (&cws->fsm);
        nn_ep_stopped (cws->ep);
        return;
    }

    nn_fsm_bad_state (cws->state, src, type);
}